

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh_ptr.h
# Opt level: O1

ShPtr<HG::SessionImpl>
make_myshared<HG::SessionImpl,void(*)(Session_cb_t*,int),Session_cb_t*>
          (_func_void_Session_cb_t_ptr_int *args,Session_cb_t *args_1)

{
  undefined8 *puVar1;
  SessionImpl *this;
  Session_cb_t *in_RDX;
  
  puVar1 = (undefined8 *)operator_new(0x10);
  this = (SessionImpl *)operator_new(0x18);
  HG::SessionImpl::SessionImpl(this,(SessionHandlerCallerPtr)args_1,in_RDX);
  *puVar1 = this;
  puVar1[1] = 1;
  *(undefined8 **)args = puVar1;
  return (ShPtr<HG::SessionImpl>)(ShPtrRep *)args;
}

Assistant:

ShPtr<T> make_myshared(Args... args) {
    // Can be optimized to have just one allocation
    return ShPtr<T>(new ShPtrRep(new T(std::forward<Args>(args)...)));
}